

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<2,_5,_1>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float local_78;
  VecAccess<float,_4,_3> local_70;
  Mat2 local_58;
  Vector<float,_3> local_48 [2];
  float local_2c;
  undefined1 local_28 [4];
  Type_conflict in1;
  Type in0;
  InputType in1Type_local;
  InputType in0Type_local;
  ShaderEvalContext *evalCtx_local;
  
  in0.m_data.m_data[1].m_data[0] = (float)in1Type;
  in0.m_data.m_data[1].m_data[1] = (float)in0Type;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,5>
              ((MatrixCaseUtils *)local_28,evalCtx,0);
  }
  else {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<0,5>
              ((MatrixCaseUtils *)local_28,evalCtx,0);
  }
  if (in0.m_data.m_data[1].m_data[0] == 2.8026e-45) {
    local_78 = sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,1>(evalCtx,1);
  }
  else {
    local_78 = sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<0,1>(evalCtx,1);
  }
  local_2c = local_78;
  tcu::operator*((tcu *)&local_58,(Matrix<float,_2,_2> *)local_28,local_78);
  reduceToVec3((MatrixCaseUtils *)local_48,&local_58);
  tcu::Vector<float,_4>::xyz(&local_70,&evalCtx->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_70,local_48);
  tcu::Matrix<float,_2,_2>::~Matrix(&local_58);
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)local_28);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}